

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O1

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetCameraResolution
          (VClient *this,string *i_rCameraName,uint *o_rResolutionX,uint *o_rResolutionY)

{
  bool bVar1;
  VCameraInfo *pVVar2;
  Enum EVar3;
  Enum GetResult;
  scoped_lock Lock;
  Enum local_34;
  unique_lock<boost::recursive_mutex> local_30;
  
  local_30.m = &this->m_FrameMutex;
  local_30.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_30);
  local_34 = Success;
  ClientUtils::Clear(o_rResolutionX);
  ClientUtils::Clear(o_rResolutionY);
  bVar1 = InitGet(this,&local_34);
  if (bVar1) {
    pVVar2 = GetCamera(this,i_rCameraName,&local_34);
    if (pVVar2 == (VCameraInfo *)0x0) {
      o_rResolutionY = (uint *)(ulong)local_34;
    }
    else {
      *o_rResolutionX = pVVar2->m_ResolutionX;
      *o_rResolutionY = pVVar2->m_ResolutionY;
    }
    EVar3 = (Enum)o_rResolutionY;
    if (pVVar2 == (VCameraInfo *)0x0) goto LAB_0013015b;
  }
  EVar3 = local_34;
LAB_0013015b:
  if (local_30.is_locked == true) {
    boost::recursive_mutex::unlock(local_30.m);
  }
  return EVar3;
}

Assistant:

Result::Enum VClient::GetCameraResolution( const std::string & i_rCameraName, unsigned int & o_rResolutionX, unsigned int & o_rResolutionY ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Result::Enum GetResult = Result::Success;
  if( InitGet( GetResult, o_rResolutionX, o_rResolutionY ) )
  {
    const ViconCGStream::VCameraInfo* pCamera = GetCamera( i_rCameraName, GetResult );
    if( !pCamera )
    {
      return GetResult;
    }

    o_rResolutionX = pCamera->m_ResolutionX;
    o_rResolutionY = pCamera->m_ResolutionY;
  }

  return GetResult;
}